

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

bool __thiscall ON_Matrix::IsColOrthoNormal(ON_Matrix *this)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  double ***pppdVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  
  bVar2 = IsColOrthoganal(this);
  uVar1 = this->m_row_count;
  pppdVar5 = &this->m;
  if (uVar1 == (this->m_rowmem).m_count) {
    pppdVar5 = &(this->m_rowmem).m_a;
  }
  uVar3 = 0;
  if (bVar2) {
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar3;
    }
    uVar6 = (ulong)(uint)this->m_col_count;
    if (this->m_col_count < 1) {
      uVar6 = uVar3;
    }
    uVar3 = 1;
    for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      dVar9 = 0.0;
      for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
        dVar9 = dVar9 + (*pppdVar5)[uVar8][uVar7] * (*pppdVar5)[uVar8][uVar7];
      }
      uVar3 = (ulong)((byte)uVar3 & ABS(1.0 - dVar9) < 1.490116119385e-08);
    }
  }
  return SUB81(uVar3,0);
}

Assistant:

bool ON_Matrix::IsColOrthoNormal() const
{
  double d;
  int i, j;
  bool rc = IsColOrthoganal();
  double const*const* this_m = ThisM();
  if ( rc ) {
    for ( j = 0; j < m_col_count; j++ ) {
      d = 0.0;
      for ( i = 0; i < m_row_count; i++ ) {
        d += this_m[i][j]*this_m[i][j];
      }
      if ( fabs(1.0-d) >=  ON_SQRT_EPSILON )
        rc = false;
    }
  }
  return rc;
}